

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection_Test::
NoFieldPresenceTest_TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection_Test
          (NoFieldPresenceTest_TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection_Test *this
          )

{
  NoFieldPresenceTest_TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__NoFieldPresenceTest_TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection_Test_029def60
  ;
  return;
}

Assistant:

TEST(NoFieldPresenceTest,
     TestEmptyExplicitSubMessageMapEntriesPopulatedInReflection) {
  // For map entries, test that you can set and read zero values.
  // Importantly this means that proto3 map fields behave like explicit
  // presence in reflection! i.e. they can be accessed even when zeroed.

  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_explicit_foreign_message =
      desc->FindFieldByName("map_int32_explicit_foreign_message");

  // Set zero values for zero keys and test that.
  (*message.mutable_map_int32_explicit_foreign_message())[0];

  // These map entries are considered valid in reflection APIs.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_explicit_foreign_message));
  const google::protobuf::Message& explicit_msg_map_entry = r->GetRepeatedMessage(
      message, field_map_int32_explicit_foreign_message, /*index=*/0);

  // If map entries are truly "no presence", then they should not return true
  // for HasField!
  // However, the existing behavior is that map entries behave like
  // explicit-presence fields in reflection -- i.e. they must return true for
  // HasField even though they are zero.
  EXPECT_THAT(explicit_msg_map_entry, MapEntryHasKey());
  EXPECT_THAT(explicit_msg_map_entry, MapEntryHasValue());
  EXPECT_THAT(explicit_msg_map_entry, MapEntryListFieldsSize(2));

  // For value types that are messages, further test that the message fields
  // do not show up on reflection.
  EXPECT_FALSE(MapValueSubMessageHasFieldViaReflection(
      message.map_int32_explicit_foreign_message().at(0)));
}